

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O2

void __thiscall
OpenMD::ForTorCorrFunc::validateSelection(ForTorCorrFunc *this,SelectionManager *seleMan)

{
  uint uVar1;
  StuntDouble *pSVar2;
  int i;
  int local_54;
  undefined8 local_50 [4];
  
  pSVar2 = SelectionManager::beginSelected(seleMan,&local_54);
  while (pSVar2 != (StuntDouble *)0x0) {
    if (1 < pSVar2->objType_ - otDAtom) {
      uVar1 = pSVar2->globalIndex_;
      (*pSVar2->_vptr_StuntDouble[7])((string *)local_50,pSVar2);
      snprintf(painCave.errMsg,2000,
               "ForTorCorrFunc::validateSelection Error: selection %d (%s)\n\t is not a Directional object\n"
               ,(ulong)uVar1,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      painCave.isFatal = 1;
      simError();
    }
    pSVar2 = SelectionManager::nextSelected(seleMan,&local_54);
  }
  return;
}

Assistant:

void ForTorCorrFunc::validateSelection(SelectionManager& seleMan) {
    StuntDouble* sd;
    int i;

    for (sd = seleMan.beginSelected(i); sd != NULL;
         sd = seleMan.nextSelected(i)) {
      if (!sd->isDirectional()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForTorCorrFunc::validateSelection Error: selection "
                 "%d (%s)\n"
                 "\t is not a Directional object\n",
                 sd->getGlobalIndex(), sd->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }